

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsSTR::~gdsSTR(gdsSTR *this)

{
  gdsSTR *this_local;
  
  std::vector<gdsBOX,_std::allocator<gdsBOX>_>::~vector(&this->BOX);
  std::vector<gdsNODE,_std::allocator<gdsNODE>_>::~vector(&this->NODE);
  std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::~vector(&this->TEXT);
  std::vector<gdsAREF,_std::allocator<gdsAREF>_>::~vector(&this->AREF);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::~vector(&this->SREF);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::~vector(&this->PATH);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::~vector(&this->BOUNDARY);
  std::vector<int,_std::allocator<int>_>::~vector(&this->last_modified);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

gdsSTR(){}